

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

void __thiscall despot::Tag::InitialBelief(Tag *this)

{
  string *in_RDX;
  State *in_RSI;
  
  InitialBelief((Tag *)&this[-1].super_BaseTag.default_action_,in_RSI,in_RDX);
  return;
}

Assistant:

Belief* Tag::InitialBelief(const State* start, string type) const {
	Belief* prior = NULL;
	if (type == "EXACT") {
		prior = ExactPrior();
	} else if (type == "DEFAULT" || type == "PARTICLE") {
		prior = ApproxPrior();
	} else {
		cerr << "[Tag::InitialBelief] Unsupported belief type: " << type << endl;
		exit(0);
	}

	return prior;
}